

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v8::detail::default_arg_formatter<char16_t>::operator()
          (default_arg_formatter<char16_t> *this,longdouble value)

{
  basic_format_specs<char16_t> specs;
  ulong uVar1;
  long lVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar3;
  undefined2 uStack_f;
  undefined1 uStack_d;
  uint local_4;
  
  local_4 = CONCAT31(local_4._1_3_,1);
  lVar2 = (ulong)local_4 << 0x20;
  uVar1 = CONCAT44(0x20,(uint)CONCAT12(uStack_d,uStack_f) << 8) & 0xfffffffffffe00ff;
  specs.type = (char)uVar1;
  specs._9_3_ = (int3)(uVar1 >> 8);
  specs.fill.data_[0] = (short)(uVar1 >> 0x20);
  specs.fill.data_[1] = (short)(uVar1 >> 0x30);
  specs.width = 0;
  specs.precision = -1;
  specs.fill.data_[2] = (short)lVar2;
  specs.fill.data_[3] = (short)((ulong)lVar2 >> 0x10);
  specs.fill.size_ = (char)((ulong)lVar2 >> 0x20);
  specs.fill._9_1_ = (char)((ulong)lVar2 >> 0x28);
  specs._22_2_ = (short)((ulong)lVar2 >> 0x30);
  bVar3 = write<char16_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_long_double,_0>
                    ((this->out).container,value,specs,(locale_ref)0x0);
  return (iterator)bVar3.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }